

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::ShortByteData
          (ShortByteData<tcu::Vector<int,_4>_> *this,int size,Vector<int,_4> *value,
          GLenum internalformat,GLenum format)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&this->data,(ulong)(uint)(size * size),value,&local_31);
  uVar9 = (ulong)(uint)(size * size * 4);
  std::vector<short,_std::allocator<short>_>::vector(&this->datas,uVar9,&local_32);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->datab,uVar9,&local_33);
  if ((format == 0x8d94) || (format == 0x1903)) {
    pVVar1 = (this->data).
             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar2 = (this->data).
             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar7 = 3;
    for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < (ulong)((long)pVVar2 - (long)pVVar1 >> 4) >> 2;
        uVar8 = uVar8 + 1) {
      pVVar1[uVar9].m_data[0] = pVVar1[uVar7 - 3].m_data[0];
      pVVar1[uVar9].m_data[1] = pVVar1[uVar7 - 2].m_data[0];
      pVVar1[uVar9].m_data[2] = pVVar1[uVar7 - 1].m_data[0];
      pVVar1[uVar9].m_data[3] = pVVar1[uVar7].m_data[0];
      uVar7 = uVar7 + 4;
    }
  }
  if ((internalformat == 0x8d88) || (internalformat == 0x8d76)) {
    psVar3 = (this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar1 = (this->data).
             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar4 = (this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar9 = 0; (uVar9 & 0xffffffff) < (ulong)((long)psVar3 - (long)psVar4 >> 1);
        uVar9 = uVar9 + 4) {
      psVar4[uVar9 & 0xffffffff] = (short)pVVar1->m_data[uVar9];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(pVVar1->m_data + uVar9 + 1);
      auVar10 = pshuflw(auVar10,auVar10,0xe8);
      *(int *)(psVar4 + uVar9 + 1) = auVar10._0_4_;
      psVar4[uVar9 + 3] = *(short *)(pVVar1->m_data + uVar9 + 3);
    }
  }
  bVar5 = Bytes(internalformat);
  if (bVar5) {
    uVar7 = 3;
    while( true ) {
      uVar8 = uVar7 - 3;
      uVar9 = (ulong)uVar8;
      if ((ulong)((long)(this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->datas).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start >> 1) <= uVar9) break;
      if ((internalformat == 0x8d8e) || (internalformat == 0x8d7c)) {
        uVar8 = uVar8 >> 2;
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].m_data[0];
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 - 2] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].m_data[1];
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 - 1] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].m_data[2];
        cVar6 = (char)(this->data).
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].m_data[3];
      }
      else {
        uVar8 = uVar8 >> 2;
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].m_data[0] * '\x7f';
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 - 2] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].m_data[1] * '\x7f';
        (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 - 1] =
             (char)(this->data).
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].m_data[2] * '\x7f';
        cVar6 = (char)(this->data).
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].m_data[3] * '\x7f';
      }
      (this->datab).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = cVar6;
      uVar7 = uVar7 + 4;
    }
  }
  return;
}

Assistant:

ShortByteData(int size, const T& value, GLenum internalformat, GLenum format)
		: data(size * size, value), datas(size * size * 4), datab(size * size * 4)
	{
		if (Components(format) == 1)
			for (unsigned i = 0; i < data.size() / 4; ++i)
			{
				data[i][0] = data[i * 4][0];
				data[i][1] = data[i * 4 + 1][0];
				data[i][2] = data[i * 4 + 2][0];
				data[i][3] = data[i * 4 + 3][0];
			}
		if (Shorts(internalformat))
		{
			for (unsigned i = 0; i < datas.size(); i += 4)
			{
				datas[i]	 = static_cast<GLshort>(data[i / 4][0]);
				datas[i + 1] = static_cast<GLshort>(data[i / 4][1]);
				datas[i + 2] = static_cast<GLshort>(data[i / 4][2]);
				datas[i + 3] = static_cast<GLshort>(data[i / 4][3]);
			}
		}
		if (Bytes(internalformat))
		{
			for (unsigned i = 0; i < datas.size(); i += 4)
			{
				if (internalformat == GL_RGBA8I || internalformat == GL_RGBA8UI)
				{
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0]);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1]);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2]);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3]);
				}
				else if (internalformat == GL_RGBA8)
				{
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0] * 255);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1] * 255);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2] * 255);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3] * 255);
				}
				else
				{ // GL_RGBA8_SNORM
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0] * 127);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1] * 127);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2] * 127);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3] * 127);
				}
			}
		}
	}